

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O3

int __thiscall indk::Neuron::getState(Neuron *this,int64_t tT)

{
  pointer ppVar1;
  bool bVar2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  *e;
  pointer ppVar3;
  
  ppVar3 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar3 == ppVar1) {
      return (tT < (this->t).super___atomic_base<long>._M_i) + 1;
    }
    bVar2 = Entry::doCheckState(ppVar3->second,tT);
    if (!bVar2) break;
    ppVar3 = ppVar3 + 1;
  }
  return 0;
}

Assistant:

int indk::Neuron::getState(int64_t tT) const {
    for (const auto &e: Entries) {
        if (!e.second->doCheckState(tT)) {
            return States::NotProcessed;
        }
    }
    if (tT >= t.load()) return States::Pending;
    return States::Computed;
}